

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitGlobalGet(BinaryInstWriter *this,GlobalGet *curr)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  size_t sVar4;
  size_t in_RCX;
  ulong uVar5;
  void *__buf;
  void *__buf_00;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  _Hash_node_base *p_Var8;
  ulong uVar9;
  LEB<unsigned_int,_unsigned_char> local_3c;
  LEB<unsigned_int,_unsigned_char> local_38;
  uchar local_32 [2];
  
  uVar3 = WasmBinaryWriter::getGlobalIndex(this->parent,(Name)(curr->name).super_IString.str);
  uVar9 = (this->extractedGets)._M_h._M_bucket_count;
  uVar5 = (ulong)curr % uVar9;
  p_Var6 = (this->extractedGets)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var8 = p_Var6->_M_nxt, p_Var7 = p_Var6, (GlobalGet *)p_Var6->_M_nxt[1]._M_nxt != curr)) {
    while (p_Var6 = p_Var8, p_Var8 = p_Var6->_M_nxt, in_RCX = uVar5,
          p_Var8 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var8[1]._M_nxt % uVar9 != uVar5) ||
         (p_Var7 = p_Var6, (GlobalGet *)p_Var8[1]._M_nxt == curr)) goto LAB_00caa32c;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00caa32c:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var8 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var8 = p_Var7->_M_nxt;
  }
  if (p_Var8 == (_Hash_node_base *)0x0) {
    sVar4 = wasm::Type::size(&(curr->super_SpecificExpression<(wasm::Expression::Id)10>).
                              super_Expression.type);
    if (sVar4 != 0) {
      uVar9 = 1;
      do {
        pvVar1 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_32[1] = 0x23;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (pvVar1,local_32 + 1);
        local_38.value = uVar3;
        LEB<unsigned_int,_unsigned_char>::write(&local_38,(int)pvVar1,__buf_00,in_RCX);
        uVar3 = uVar3 + 1;
        bVar2 = uVar9 < sVar4;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar2);
    }
  }
  else {
    pvVar1 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    local_32[0] = '#';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (pvVar1,local_32);
    local_3c.value = uVar3 + *(int *)&p_Var8[2]._M_nxt;
    LEB<unsigned_int,_unsigned_char>::write(&local_3c,(int)pvVar1,__buf,in_RCX);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitGlobalGet(GlobalGet* curr) {
  Index index = parent.getGlobalIndex(curr->name);
  if (auto it = extractedGets.find(curr); it != extractedGets.end()) {
    // We have a tuple of globals to get, but we will only end up using one of
    // them, so we can just emit that one.
    o << int8_t(BinaryConsts::GlobalGet) << U32LEB(index + it->second);
    return;
  }
  // Emit a global.get for each element if this is a tuple global
  size_t numValues = curr->type.size();
  for (Index i = 0; i < numValues; ++i) {
    o << int8_t(BinaryConsts::GlobalGet) << U32LEB(index + i);
  }
}